

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::ObjectIntersectorK<4,_false>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  NodeRef *pNVar2;
  NodeRef *pNVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar19;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar20;
  bool bVar21;
  uint uVar22;
  undefined4 uVar23;
  ulong uVar24;
  size_t sVar25;
  size_t sVar26;
  _func_int **pp_Var27;
  long lVar28;
  size_t sVar29;
  size_t sVar30;
  ulong uVar31;
  size_t sVar32;
  ulong uVar33;
  ulong uVar34;
  NodeRef nodeRef;
  NodeRef *pNVar35;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  bool bVar37;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar44 [64];
  vint4 ai_2;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 ai;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  vint4 ai_1;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  vint4 ai_3;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  vint4 bi;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vint4 bi_1;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 bi_3;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  vint4 bi_2;
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  vint4 bi_8;
  undefined1 auVar78 [64];
  float fVar79;
  float fVar82;
  undefined1 auVar81 [64];
  RTCIntersectFunctionNArguments local_17c0;
  Geometry *local_1790;
  undefined8 local_1788;
  RTCIntersectArguments *local_1780;
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  undefined1 auVar80 [16];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar80 = in_ZMM0._0_16_;
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
      auVar42 = vpcmpeqd_avx(auVar80,(undefined1  [16])valid_i->field_0);
      uVar22 = vmovmskps_avx(auVar42);
      if (uVar22 == 0) {
        return;
      }
      stack_node[0xaa].ptr = (size_t)This->ptr;
      stack_node[0xab].ptr = (size_t)(uVar22 & 0xff);
      auVar53._8_4_ = 0x7fffffff;
      auVar53._0_8_ = 0x7fffffff7fffffff;
      auVar53._12_4_ = 0x7fffffff;
      auVar40 = *(undefined1 (*) [16])(ray + 0x40);
      auVar54 = vandps_avx(auVar40,auVar53);
      auVar62._8_4_ = 0x219392ef;
      auVar62._0_8_ = 0x219392ef219392ef;
      auVar62._12_4_ = 0x219392ef;
      auVar54 = vcmpps_avx(auVar54,auVar62,1);
      auVar45 = vblendvps_avx(auVar40,auVar62,auVar54);
      auVar54 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar53);
      auVar54 = vcmpps_avx(auVar54,auVar62,1);
      auVar56 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,auVar54);
      auVar54 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar53);
      auVar54 = vcmpps_avx(auVar54,auVar62,1);
      auVar54 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,auVar54);
      auVar53 = vrcpps_avx(auVar45);
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = &DAT_3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar45 = vfnmadd213ps_fma(auVar45,auVar53,auVar63);
      auVar53 = vfmadd132ps_fma(auVar45,auVar53,auVar53);
      auVar73 = ZEXT1664(auVar53);
      auVar45 = vrcpps_avx(auVar56);
      auVar56 = vfnmadd213ps_fma(auVar56,auVar45,auVar63);
      auVar56 = vfmadd132ps_fma(auVar56,auVar45,auVar45);
      auVar74 = ZEXT1664(auVar56);
      auVar45 = vrcpps_avx(auVar54);
      auVar54 = vfnmadd213ps_fma(auVar54,auVar45,auVar63);
      auVar45 = vfmadd132ps_fma(auVar54,auVar45,auVar45);
      auVar75 = ZEXT1664(auVar45);
      auVar62 = ZEXT816(0) << 0x20;
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar62);
      stack_node[0xbe].ptr = auVar54._0_8_;
      stack_node[0xbf].ptr = auVar54._8_8_;
      auVar54 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar62);
      stack_node[0xbc].ptr = auVar54._0_8_;
      stack_node[0xbd].ptr = auVar54._8_8_;
      auVar40 = vcmpps_avx(auVar40,auVar62,1);
      auVar54._8_4_ = 1;
      auVar54._0_8_ = 0x100000001;
      auVar54._12_4_ = 1;
      auVar40 = vandps_avx(auVar40,auVar54);
      auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar62,1);
      auVar64._8_4_ = 2;
      auVar64._0_8_ = 0x200000002;
      auVar64._12_4_ = 2;
      auVar54 = vandps_avx(auVar54,auVar64);
      auVar54 = vorps_avx(auVar54,auVar40);
      auVar55._8_4_ = 4;
      auVar55._0_8_ = 0x400000004;
      auVar55._12_4_ = 4;
      auVar40 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar62,1);
      auVar40 = vandps_avx(auVar40,auVar55);
      auVar80 = vpor_avx(auVar42 ^ auVar80,auVar40);
      auVar80 = vpor_avx(auVar80,auVar54);
      stack_node[0xb6].ptr = auVar80._0_8_;
      stack_node[0xb7].ptr = auVar80._8_8_;
      stack_node[0xc4].ptr._0_4_ = *(float *)ray;
      stack_node[0xc4].ptr._4_4_ = *(float *)(ray + 4);
      stack_node[0xc5].ptr._0_4_ = *(float *)(ray + 8);
      stack_node[0xc5].ptr._4_4_ = *(float *)(ray + 0xc);
      fVar79 = auVar53._0_4_ * -*(float *)ray;
      fVar82 = auVar53._4_4_ * -*(float *)(ray + 4);
      auVar80._0_8_ = CONCAT44(fVar82,fVar79);
      auVar80._8_4_ = auVar53._8_4_ * -*(float *)(ray + 8);
      auVar80._12_4_ = auVar53._12_4_ * -*(float *)(ray + 0xc);
      auVar77 = ZEXT1664(auVar80);
      stack_node[0xc2].ptr._0_4_ = *(float *)(ray + 0x10);
      stack_node[0xc2].ptr._4_4_ = *(float *)(ray + 0x14);
      stack_node[0xc3].ptr._0_4_ = *(float *)(ray + 0x18);
      stack_node[0xc3].ptr._4_4_ = *(float *)(ray + 0x1c);
      stack_node[0xc0].ptr._0_4_ = *(float *)(ray + 0x20);
      stack_node[0xc0].ptr._4_4_ = *(float *)(ray + 0x24);
      stack_node[0xc1].ptr._0_4_ = *(float *)(ray + 0x28);
      stack_node[0xc1].ptr._4_4_ = *(float *)(ray + 0x2c);
      stack_node[0xba].ptr._0_4_ = 0x80000000;
      stack_node[0xba].ptr._4_4_ = 0x80000000;
      stack_node[0xbb].ptr._0_4_ = 0x80000000;
      stack_node[0xbb].ptr._4_4_ = 0x80000000;
      auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      stack_node[0x99].ptr = 8;
      stack_node[0xb8].ptr._0_4_ = 0x7f800000;
      stack_node[0xb8].ptr._4_4_ = 0x7f800000;
      stack_node[0xb9].ptr._0_4_ = 0x7f800000;
      stack_node[0xb9].ptr._4_4_ = 0x7f800000;
      stack_node[0xad].ptr = (size_t)context;
      stack_node[0xac].ptr = (size_t)ray;
      stack_node[0xcc].ptr = auVar53._0_8_;
      stack_node[0xcd].ptr = auVar53._8_8_;
      stack_node[0xca].ptr = auVar56._0_8_;
      stack_node[0xcb].ptr = auVar56._8_8_;
      stack_node[200].ptr = auVar45._0_8_;
      stack_node[0xc9].ptr = auVar45._8_8_;
      stack_node[0xc6].ptr = auVar80._0_8_;
      stack_node[199].ptr = auVar80._8_8_;
      stack_node[0xb4].ptr._0_4_ = auVar56._0_4_ * -*(float *)(ray + 0x10);
      stack_node[0xb4].ptr._4_4_ = auVar56._4_4_ * -*(float *)(ray + 0x14);
      stack_node[0xb5].ptr._0_4_ = auVar56._8_4_ * -*(float *)(ray + 0x18);
      stack_node[0xb5].ptr._4_4_ = auVar56._12_4_ * -*(float *)(ray + 0x1c);
      stack_node[0xb2].ptr._0_4_ = auVar45._0_4_ * -*(float *)(ray + 0x20);
      stack_node[0xb2].ptr._4_4_ = auVar45._4_4_ * -*(float *)(ray + 0x24);
      stack_node[0xb3].ptr._0_4_ = auVar45._8_4_ * -*(float *)(ray + 0x28);
      stack_node[0xb3].ptr._4_4_ = auVar45._12_4_ * -*(float *)(ray + 0x2c);
LAB_00596ff1:
      lVar28 = 0;
      for (uVar24 = stack_node[0xab].ptr; (uVar24 & 1) == 0;
          uVar24 = uVar24 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar23 = *(undefined4 *)((long)&stack_node[0xb6].ptr + lVar28 * 4);
      auVar40._4_4_ = uVar23;
      auVar40._0_4_ = uVar23;
      auVar40._8_4_ = uVar23;
      auVar40._12_4_ = uVar23;
      auVar63 = vpcmpeqd_avx(auVar40,stack_node._1456_16_);
      uVar23 = vmovmskps_avx(auVar63);
      stack_node[0xab].ptr = ~CONCAT44((int)((ulong)lVar28 >> 0x20),uVar23) & stack_node[0xab].ptr;
      auVar55 = auVar76._0_16_;
      auVar80 = vblendvps_avx(auVar55,auVar73._0_16_,auVar63);
      auVar42 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar42 = vminps_avx(auVar42,auVar80);
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      auVar80 = vblendvps_avx(auVar55,auVar74._0_16_,auVar63);
      auVar42 = vminps_avx(auVar40,auVar42);
      auVar40 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar80 = vminps_avx(auVar40,auVar80);
      auVar40 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vminps_avx(auVar40,auVar80);
      auVar42 = vinsertps_avx(auVar42,auVar80,0x1c);
      auVar80 = vblendvps_avx(auVar55,auVar75._0_16_,auVar63);
      auVar40 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar80 = vminps_avx(auVar40,auVar80);
      auVar40 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vminps_avx(auVar40,auVar80);
      auVar56 = vinsertps_avx(auVar42,auVar80,0x20);
      auVar50._8_4_ = 0xff800000;
      auVar50._0_8_ = 0xff800000ff800000;
      auVar50._12_4_ = 0xff800000;
      auVar80 = vblendvps_avx(auVar50,auVar73._0_16_,auVar63);
      auVar42 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar42 = vmaxps_avx(auVar42,auVar80);
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      auVar80 = vblendvps_avx(auVar50,auVar74._0_16_,auVar63);
      auVar42 = vmaxps_avx(auVar40,auVar42);
      auVar40 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar80 = vmaxps_avx(auVar40,auVar80);
      auVar40 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxps_avx(auVar40,auVar80);
      auVar42 = vinsertps_avx(auVar42,auVar80,0x1c);
      auVar80 = vblendvps_avx(auVar50,auVar75._0_16_,auVar63);
      auVar40 = vshufps_avx(auVar80,auVar80,0xb1);
      auVar80 = vmaxps_avx(auVar40,auVar80);
      auVar40 = vshufpd_avx(auVar80,auVar80,1);
      auVar80 = vmaxps_avx(auVar40,auVar80);
      auVar53 = vinsertps_avx(auVar42,auVar80,0x20);
      auVar45 = vcmpps_avx(auVar56,_DAT_01feba10,5);
      auVar80 = vblendvps_avx(auVar53,auVar56,auVar45);
      auVar42 = vmovshdup_avx(auVar80);
      stack_node[0xb1].ptr = (ulong)(auVar42._0_4_ < 0.0) << 4 | 0x20;
      auVar42 = vshufpd_avx(auVar80,auVar80,1);
      uVar34 = (ulong)(auVar42._0_4_ < 0.0) << 4 | 0x40;
      stack_node[0xb0].ptr = stack_node[0xb1].ptr ^ 0x10;
      stack_node[0xe8].ptr._0_4_ = auVar80._0_4_;
      auVar9._4_4_ = stack_node[0xc4].ptr._4_4_;
      auVar9._0_4_ = (float)stack_node[0xc4].ptr;
      auVar9._8_4_ = (float)stack_node[0xc5].ptr;
      auVar9._12_4_ = stack_node[0xc5].ptr._4_4_;
      auVar42 = vblendvps_avx(auVar55,auVar9,auVar63);
      auVar40 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vminps_avx(auVar40,auVar42);
      auVar40 = vshufpd_avx(auVar42,auVar42,1);
      auVar40 = vminps_avx(auVar40,auVar42);
      auVar8._4_4_ = stack_node[0xc2].ptr._4_4_;
      auVar8._0_4_ = (float)stack_node[0xc2].ptr;
      auVar8._8_4_ = (float)stack_node[0xc3].ptr;
      auVar8._12_4_ = stack_node[0xc3].ptr._4_4_;
      auVar42 = vblendvps_avx(auVar55,auVar8,auVar63);
      auVar54 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vminps_avx(auVar54,auVar42);
      auVar54 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vminps_avx(auVar54,auVar42);
      auVar40 = vinsertps_avx(auVar40,auVar42,0x1c);
      auVar7._4_4_ = stack_node[0xc0].ptr._4_4_;
      auVar7._0_4_ = (float)stack_node[0xc0].ptr;
      auVar7._8_4_ = (float)stack_node[0xc1].ptr;
      auVar7._12_4_ = stack_node[0xc1].ptr._4_4_;
      auVar42 = vblendvps_avx(auVar55,auVar7,auVar63);
      auVar54 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vminps_avx(auVar54,auVar42);
      auVar54 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vminps_avx(auVar54,auVar42);
      auVar40 = vinsertps_avx(auVar40,auVar42,0x20);
      auVar42 = vblendvps_avx(auVar50,auVar9,auVar63);
      auVar54 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vmaxps_avx(auVar54,auVar42);
      auVar54 = vshufpd_avx(auVar42,auVar42,1);
      auVar54 = vmaxps_avx(auVar54,auVar42);
      auVar42 = vblendvps_avx(auVar50,auVar8,auVar63);
      auVar55 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vmaxps_avx(auVar55,auVar42);
      auVar55 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vmaxps_avx(auVar55,auVar42);
      auVar54 = vinsertps_avx(auVar54,auVar42,0x1c);
      auVar42 = vblendvps_avx(auVar50,auVar7,auVar63);
      auVar55 = vshufps_avx(auVar42,auVar42,0xb1);
      auVar42 = vmaxps_avx(auVar55,auVar42);
      auVar55 = vshufpd_avx(auVar42,auVar42,1);
      auVar42 = vmaxps_avx(auVar55,auVar42);
      auVar54 = vinsertps_avx(auVar54,auVar42,0x20);
      auVar42 = vblendvps_avx(auVar54,auVar40,auVar45);
      auVar40 = vblendvps_avx(auVar40,auVar54,auVar45);
      auVar54 = vblendvps_avx(auVar50,stack_node._1504_16_,auVar63);
      auVar55 = vshufps_avx(auVar54,auVar54,0xb1);
      stack_node[0x9a].ptr = auVar54._0_8_;
      stack_node[0x9b].ptr = auVar54._8_8_;
      auVar55 = vmaxps_avx(auVar55,auVar54);
      auVar64 = vshufpd_avx(auVar55,auVar55,1);
      auVar68._8_4_ = 0x7f800000;
      auVar68._0_8_ = 0x7f8000007f800000;
      auVar68._12_4_ = 0x7f800000;
      auVar54 = vblendvps_avx(auVar68,stack_node._1520_16_,auVar63);
      auVar62 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar62 = vminps_avx(auVar62,auVar54);
      auVar81 = ZEXT1664(CONCAT412(stack_node[0xb5].ptr._4_4_,
                                   CONCAT48((float)stack_node[0xb5].ptr,
                                            CONCAT44(stack_node[0xb4].ptr._4_4_,
                                                     (float)stack_node[0xb4].ptr))));
      auVar55 = vmaxss_avx(auVar64,auVar55);
      auVar78 = ZEXT1664(CONCAT412(stack_node[0xb3].ptr._4_4_,
                                   CONCAT48((float)stack_node[0xb3].ptr,
                                            CONCAT44(stack_node[0xb2].ptr._4_4_,
                                                     (float)stack_node[0xb2].ptr))));
      auVar54 = vblendvps_avx(auVar56,auVar53,auVar45);
      auVar59._0_4_ = auVar40._0_4_ * (float)stack_node[0xe8].ptr;
      auVar59._4_4_ = auVar40._4_4_ * auVar80._4_4_;
      auVar59._8_4_ = auVar40._8_4_ * auVar80._8_4_;
      auVar59._12_4_ = auVar40._12_4_ * auVar80._12_4_;
      stack_node[0xdc].ptr._0_4_ = auVar54._0_4_;
      auVar56._0_4_ = auVar42._0_4_ * (float)stack_node[0xdc].ptr;
      auVar56._4_4_ = auVar42._4_4_ * auVar54._4_4_;
      auVar56._8_4_ = auVar42._8_4_ * auVar54._8_4_;
      auVar56._12_4_ = auVar42._12_4_ * auVar54._12_4_;
      uVar24 = (ulong)((float)stack_node[0xe8].ptr < 0.0) * 0x10;
      stack_node[0xec].ptr = *(size_t *)(stack_node[0xaa].ptr + 0x70);
      stack_node[0xed].ptr._0_4_ = 0;
      stack_node[0xe8].ptr._4_4_ = (float)stack_node[0xe8].ptr;
      stack_node[0xe9].ptr._0_4_ = (float)stack_node[0xe8].ptr;
      stack_node[0xe9].ptr._4_4_ = (float)stack_node[0xe8].ptr;
      stack_node[0xe6].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ (uint)auVar59._0_4_;
      stack_node[0xe6].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ (uint)auVar59._0_4_;
      stack_node[0xe7].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ (uint)auVar59._0_4_;
      stack_node[0xe7].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ (uint)auVar59._0_4_;
      auVar42 = vshufps_avx(auVar80,auVar80,0x55);
      stack_node[0xe4].ptr = auVar42._0_8_;
      stack_node[0xe5].ptr = auVar42._8_8_;
      auVar42 = vshufps_avx(auVar59,auVar59,0x55);
      stack_node[0xe2].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ auVar42._0_4_;
      stack_node[0xe2].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ auVar42._4_4_;
      stack_node[0xe3].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ auVar42._8_4_;
      stack_node[0xe3].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ auVar42._12_4_;
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      stack_node[0xe0].ptr = auVar80._0_8_;
      stack_node[0xe1].ptr = auVar80._8_8_;
      auVar80 = vshufps_avx(auVar59,auVar59,0xaa);
      stack_node[0xde].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ auVar80._0_4_;
      stack_node[0xde].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ auVar80._4_4_;
      stack_node[0xdf].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ auVar80._8_4_;
      stack_node[0xdf].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ auVar80._12_4_;
      stack_node[0xdc].ptr._4_4_ = (float)stack_node[0xdc].ptr;
      stack_node[0xdd].ptr._0_4_ = (float)stack_node[0xdc].ptr;
      stack_node[0xdd].ptr._4_4_ = (float)stack_node[0xdc].ptr;
      stack_node[0xda].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ (uint)auVar56._0_4_;
      stack_node[0xda].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ (uint)auVar56._0_4_;
      stack_node[0xdb].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ (uint)auVar56._0_4_;
      stack_node[0xdb].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ (uint)auVar56._0_4_;
      auVar80 = vshufps_avx(auVar54,auVar54,0x55);
      stack_node[0xd8].ptr = auVar80._0_8_;
      stack_node[0xd9].ptr = auVar80._8_8_;
      uVar23 = auVar62._0_4_;
      auVar45._4_4_ = uVar23;
      auVar45._0_4_ = uVar23;
      auVar45._8_4_ = uVar23;
      auVar45._12_4_ = uVar23;
      auVar80 = vshufps_avx(auVar62,auVar62,0xaa);
      auVar80 = vminps_avx(auVar80,auVar45);
      stack_node[0xd6].ptr = auVar80._0_8_;
      stack_node[0xd7].ptr = auVar80._8_8_;
      auVar80 = vshufps_avx(auVar56,auVar56,0x55);
      stack_node[0xd4].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ auVar80._0_4_;
      stack_node[0xd4].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ auVar80._4_4_;
      stack_node[0xd5].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ auVar80._8_4_;
      stack_node[0xd5].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ auVar80._12_4_;
      auVar80 = vshufps_avx(auVar54,auVar54,0xaa);
      stack_node[0xd2].ptr = auVar80._0_8_;
      stack_node[0xd3].ptr = auVar80._8_8_;
      auVar80 = vshufps_avx(auVar56,auVar56,0xaa);
      stack_node[0xd0].ptr._0_4_ = (uint)stack_node[0xba].ptr ^ auVar80._0_4_;
      stack_node[0xd0].ptr._4_4_ = stack_node[0xba].ptr._4_4_ ^ auVar80._4_4_;
      stack_node[0xd1].ptr._0_4_ = (uint)stack_node[0xbb].ptr ^ auVar80._8_4_;
      stack_node[0xd1].ptr._4_4_ = stack_node[0xbb].ptr._4_4_ ^ auVar80._12_4_;
      auVar42._4_4_ = stack_node[0xb8].ptr._4_4_;
      auVar42._0_4_ = (undefined4)stack_node[0xb8].ptr;
      auVar42._8_4_ = (undefined4)stack_node[0xb9].ptr;
      auVar42._12_4_ = stack_node[0xb9].ptr._4_4_;
      auVar80 = vblendvps_avx(auVar42,stack_node._1520_16_,auVar63);
      stack_node[0xa6].ptr = auVar80._0_8_;
      stack_node[0xa7].ptr = auVar80._8_8_;
      auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
      pNVar35 = stack_node + 0xee;
      do {
        stack_node[0xea].ptr._0_4_ = auVar55._0_4_;
        stack_node[0xea].ptr._4_4_ = (undefined4)stack_node[0xea].ptr;
        stack_node[0xeb].ptr._0_4_ = (undefined4)stack_node[0xea].ptr;
        stack_node[0xeb].ptr._4_4_ = (undefined4)stack_node[0xea].ptr;
LAB_005973a9:
        do {
          do {
            if (pNVar35 == stack_node + 0xec) {
              if (stack_node[0xab].ptr == 0) {
                return;
              }
              goto LAB_00596ff1;
            }
            uVar23 = (undefined4)pNVar35[-1].ptr;
            auVar41._4_4_ = uVar23;
            auVar41._0_4_ = uVar23;
            auVar41._8_4_ = uVar23;
            auVar41._12_4_ = uVar23;
            auVar44 = ZEXT1664(auVar41);
            pNVar35 = pNVar35 + -2;
            auVar80 = vcmpps_avx(auVar41,stack_node._1232_16_,1);
          } while ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                    (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   -1 < auVar80[0xf]);
          sVar29 = pNVar35->ptr;
          while ((sVar29 & 8) == 0) {
            auVar16._4_4_ = stack_node[0xe6].ptr._4_4_;
            auVar16._0_4_ = (uint)stack_node[0xe6].ptr;
            auVar16._8_4_ = (uint)stack_node[0xe7].ptr;
            auVar16._12_4_ = stack_node[0xe7].ptr._4_4_;
            auVar17._4_4_ = stack_node[0xe8].ptr._4_4_;
            auVar17._0_4_ = (float)stack_node[0xe8].ptr;
            auVar17._8_4_ = (float)stack_node[0xe9].ptr;
            auVar17._12_4_ = stack_node[0xe9].ptr._4_4_;
            auVar80 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + uVar24),auVar16,auVar17
                                     );
            auVar15._4_4_ = stack_node[0xe2].ptr._4_4_;
            auVar15._0_4_ = (uint)stack_node[0xe2].ptr;
            auVar15._8_4_ = (uint)stack_node[0xe3].ptr;
            auVar15._12_4_ = stack_node[0xe3].ptr._4_4_;
            auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + stack_node[0xb1].ptr),
                                      auVar15,stack_node._1824_16_);
            auVar80 = vpmaxsd_avx(auVar80,auVar42);
            auVar14._4_4_ = stack_node[0xde].ptr._4_4_;
            auVar14._0_4_ = (uint)stack_node[0xde].ptr;
            auVar14._8_4_ = (uint)stack_node[0xdf].ptr;
            auVar14._12_4_ = stack_node[0xdf].ptr._4_4_;
            auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + uVar34),auVar14,
                                      stack_node._1792_16_);
            auVar42 = vpmaxsd_avx(auVar42,stack_node._1712_16_);
            auVar80 = vpmaxsd_avx(auVar80,auVar42);
            auVar12._4_4_ = stack_node[0xda].ptr._4_4_;
            auVar12._0_4_ = (uint)stack_node[0xda].ptr;
            auVar12._8_4_ = (uint)stack_node[0xdb].ptr;
            auVar12._12_4_ = stack_node[0xdb].ptr._4_4_;
            auVar13._4_4_ = stack_node[0xdc].ptr._4_4_;
            auVar13._0_4_ = (float)stack_node[0xdc].ptr;
            auVar13._8_4_ = (float)stack_node[0xdd].ptr;
            auVar13._12_4_ = stack_node[0xdd].ptr._4_4_;
            auVar42 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + (uVar24 ^ 0x10)),
                                      auVar12,auVar13);
            auVar11._4_4_ = stack_node[0xd4].ptr._4_4_;
            auVar11._0_4_ = (uint)stack_node[0xd4].ptr;
            auVar11._8_4_ = (uint)stack_node[0xd5].ptr;
            auVar11._12_4_ = stack_node[0xd5].ptr._4_4_;
            auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + stack_node[0xb0].ptr),
                                      auVar11,stack_node._1728_16_);
            auVar42 = vpminsd_avx(auVar42,auVar40);
            auVar10._4_4_ = stack_node[0xd0].ptr._4_4_;
            auVar10._0_4_ = (uint)stack_node[0xd0].ptr;
            auVar10._8_4_ = (uint)stack_node[0xd1].ptr;
            auVar10._12_4_ = stack_node[0xd1].ptr._4_4_;
            auVar40 = vfmadd132ps_fma(*(undefined1 (*) [16])(sVar29 + 0x20 + (uVar34 ^ 0x10)),
                                      auVar10,stack_node._1680_16_);
            auVar18._4_4_ = stack_node[0xea].ptr._4_4_;
            auVar18._0_4_ = (undefined4)stack_node[0xea].ptr;
            auVar18._8_4_ = (undefined4)stack_node[0xeb].ptr;
            auVar18._12_4_ = stack_node[0xeb].ptr._4_4_;
            auVar40 = vpminsd_avx(auVar40,auVar18);
            auVar42 = vpminsd_avx(auVar42,auVar40);
            stack_node[0xa8].ptr = auVar80._0_8_;
            stack_node[0xa9].ptr = auVar80._8_8_;
            auVar80 = vcmpps_avx(auVar80,auVar42,2);
            uVar22 = vmovmskps_avx(auVar80);
            if (uVar22 == 0) {
              bVar21 = false;
              sVar26 = sVar29;
            }
            else {
              uVar31 = (ulong)(uVar22 & 0xff);
              auVar44 = ZEXT1664(auVar76._0_16_);
              uVar33 = 0;
              sVar25 = 8;
              do {
                lVar28 = 0;
                for (uVar5 = uVar31; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
                  lVar28 = lVar28 + 1;
                }
                uVar23 = *(undefined4 *)(sVar29 + 0x20 + lVar28 * 4);
                auVar46._4_4_ = uVar23;
                auVar46._0_4_ = uVar23;
                auVar46._8_4_ = uVar23;
                auVar46._12_4_ = uVar23;
                auVar40 = vfmadd213ps_fma(auVar46,auVar73._0_16_,auVar77._0_16_);
                uVar23 = *(undefined4 *)(sVar29 + 0x40 + lVar28 * 4);
                auVar51._4_4_ = uVar23;
                auVar51._0_4_ = uVar23;
                auVar51._8_4_ = uVar23;
                auVar51._12_4_ = uVar23;
                auVar54 = vfmadd213ps_fma(auVar51,auVar74._0_16_,auVar81._0_16_);
                uVar23 = *(undefined4 *)(sVar29 + 0x60 + lVar28 * 4);
                auVar57._4_4_ = uVar23;
                auVar57._0_4_ = uVar23;
                auVar57._8_4_ = uVar23;
                auVar57._12_4_ = uVar23;
                auVar45 = vfmadd213ps_fma(auVar57,auVar75._0_16_,auVar78._0_16_);
                uVar23 = *(undefined4 *)(sVar29 + 0x30 + lVar28 * 4);
                auVar60._4_4_ = uVar23;
                auVar60._0_4_ = uVar23;
                auVar60._8_4_ = uVar23;
                auVar60._12_4_ = uVar23;
                auVar56 = vfmadd213ps_fma(auVar60,auVar73._0_16_,auVar77._0_16_);
                uVar23 = *(undefined4 *)(sVar29 + 0x50 + lVar28 * 4);
                auVar65._4_4_ = uVar23;
                auVar65._0_4_ = uVar23;
                auVar65._8_4_ = uVar23;
                auVar65._12_4_ = uVar23;
                auVar53 = vfmadd213ps_fma(auVar65,auVar74._0_16_,auVar81._0_16_);
                uVar23 = *(undefined4 *)(sVar29 + 0x70 + lVar28 * 4);
                auVar69._4_4_ = uVar23;
                auVar69._0_4_ = uVar23;
                auVar69._8_4_ = uVar23;
                auVar69._12_4_ = uVar23;
                auVar55 = vfmadd213ps_fma(auVar69,auVar75._0_16_,auVar78._0_16_);
                auVar80 = vpminsd_avx(auVar40,auVar56);
                auVar42 = vpminsd_avx(auVar54,auVar53);
                auVar80 = vpmaxsd_avx(auVar80,auVar42);
                auVar42 = vpminsd_avx(auVar45,auVar55);
                auVar42 = vpmaxsd_avx(auVar42,stack_node._1328_16_);
                auVar80 = vpmaxsd_avx(auVar80,auVar42);
                auVar42 = vpmaxsd_avx(auVar40,auVar56);
                auVar40 = vpmaxsd_avx(auVar54,auVar53);
                auVar40 = vpminsd_avx(auVar42,auVar40);
                auVar42 = vpmaxsd_avx(auVar45,auVar55);
                auVar42 = vpminsd_avx(auVar42,stack_node._1232_16_);
                auVar42 = vpminsd_avx(auVar40,auVar42);
                auVar80 = vcmpps_avx(auVar80,auVar42,2);
                sVar26 = sVar25;
                if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar80[0xf] < '\0') {
                  uVar23 = *(undefined4 *)((long)&stack_node[0xa8].ptr + lVar28 * 4);
                  auVar47._4_4_ = uVar23;
                  auVar47._0_4_ = uVar23;
                  auVar47._8_4_ = uVar23;
                  auVar47._12_4_ = uVar23;
                  sVar26 = *(size_t *)(sVar29 + lVar28 * 8);
                  auVar42 = auVar44._0_16_;
                  auVar80 = vcmpps_avx(auVar47,auVar42,1);
                  if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < auVar80[0xf]) {
                    pNVar35->ptr = sVar26;
                    sVar26 = sVar25;
                  }
                  else {
                    if (sVar25 == 8) {
                      auVar44 = ZEXT1664(auVar47);
                      goto LAB_005975ae;
                    }
                    pNVar35->ptr = sVar25;
                    auVar44 = ZEXT1664(auVar47);
                    auVar47 = auVar42;
                  }
                  uVar33 = uVar33 + 1;
                  *(int *)&pNVar35[1].ptr = auVar47._0_4_;
                  pNVar35 = pNVar35 + 2;
                }
LAB_005975ae:
                uVar31 = uVar31 - 1 & uVar31;
                sVar25 = sVar26;
              } while (uVar31 != 0);
              if (sVar26 == 8) {
                bVar21 = false;
              }
              else {
                bVar21 = true;
                if (1 < uVar33) {
                  pNVar3 = pNVar35 + -4;
                  pNVar1 = pNVar35 + -2;
                  if ((uint)pNVar35[-3].ptr < (uint)pNVar35[-1].ptr) {
                    stack_node[0x9c].ptr = pNVar3->ptr;
                    stack_node[0x9d].ptr = pNVar35[-3].ptr;
                    *(int *)&pNVar35[-3].ptr = (int)pNVar35[-1].ptr;
                    pNVar3->ptr = pNVar1->ptr;
                    pNVar1->ptr = stack_node[0x9c].ptr;
                    *(undefined4 *)&pNVar35[-1].ptr = (undefined4)stack_node[0x9d].ptr;
                  }
                  stack_node[0x99].ptr = 8;
                  if (uVar33 != 2) {
                    pNVar2 = pNVar35 + -6;
                    if ((uint)pNVar35[-5].ptr < (uint)pNVar35[-1].ptr) {
                      stack_node[0x9c].ptr = pNVar2->ptr;
                      stack_node[0x9d].ptr = pNVar35[-5].ptr;
                      *(int *)&pNVar35[-5].ptr = (int)pNVar35[-1].ptr;
                      pNVar2->ptr = pNVar1->ptr;
                      pNVar1->ptr = stack_node[0x9c].ptr;
                      *(undefined4 *)&pNVar35[-1].ptr = (undefined4)stack_node[0x9d].ptr;
                    }
                    stack_node[0x99].ptr = 8;
                    if ((uint)pNVar35[-5].ptr < (uint)pNVar35[-3].ptr) {
                      stack_node[0x9c].ptr = pNVar2->ptr;
                      stack_node[0x9d].ptr = pNVar35[-5].ptr;
                      *(int *)&pNVar35[-5].ptr = (int)pNVar35[-3].ptr;
                      pNVar2->ptr = pNVar3->ptr;
                      pNVar3->ptr = stack_node[0x9c].ptr;
                      *(undefined4 *)&pNVar35[-3].ptr = (undefined4)stack_node[0x9d].ptr;
                    }
                  }
                }
              }
            }
            sVar29 = sVar26;
            if (!bVar21) goto LAB_005973a9;
          }
          auVar80 = vcmpps_avx(stack_node._1232_16_,auVar44._0_16_,6);
          auVar44 = ZEXT1664(auVar80);
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar80[0xf]) goto LAB_005973a9;
          stack_node[0xae].ptr = (ulong)((uint)sVar29 & 0xf) - 8;
          if (stack_node[0xae].ptr != 0) {
            stack_node[0xaf].ptr = 0;
            stack_node[0xce].ptr = auVar80._0_8_;
            stack_node[0xcf].ptr = auVar80._8_8_;
            do {
              stack_node[0xa1].ptr._4_4_ =
                   *(uint *)((sVar29 & 0xfffffffffffffff0) + stack_node[0xaf].ptr * 8);
              stack_node[0xa2].ptr =
                   (size_t)(context->scene->geometries).items[stack_node[0xa1].ptr._4_4_].ptr;
              uVar22 = ((Geometry *)stack_node[0xa2].ptr)->mask;
              auVar43._4_4_ = uVar22;
              auVar43._0_4_ = uVar22;
              auVar43._8_4_ = uVar22;
              auVar43._12_4_ = uVar22;
              auVar80 = vpand_avx(auVar43,*(undefined1 (*) [16])(ray + 0x90));
              auVar80 = vpcmpeqd_avx(auVar80,_DAT_01feba10);
              auVar42 = auVar44._0_16_ & ~auVar80;
              if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar42[0xf] < '\0') {
                stack_node._1344_16_ = vandnps_avx(auVar80,auVar44._0_16_);
                stack_node[0x9e].ptr._0_4_ =
                     *(undefined4 *)((sVar29 & 0xfffffffffffffff0) + 4 + stack_node[0xaf].ptr * 8);
                stack_node[0x9c].ptr = (size_t)(stack_node + 0xa8);
                stack_node[0x9d].ptr = (size_t)((Geometry *)stack_node[0xa2].ptr)->userPtr;
                stack_node[0x9f].ptr = (size_t)context->user;
                stack_node[0xa1].ptr._0_4_ = 4;
                stack_node[0xa3].ptr = 0;
                stack_node[0xa4].ptr = (size_t)context->args;
                pp_Var27 = (_func_int **)((RTCIntersectArguments *)stack_node[0xa4].ptr)->intersect;
                if (pp_Var27 == (_func_int **)0x0) {
                  pp_Var27 = (((Geometry *)(stack_node[0xa2].ptr + 0x60))->super_RefCount).
                             _vptr_RefCount;
                }
                stack_node[0x99].ptr = 0x597789;
                stack_node[0xa0].ptr = (size_t)ray;
                (*(code *)pp_Var27)((RTCIntersectFunctionNArguments *)(stack_node + 0x9c));
                auVar73 = ZEXT1664(stack_node._1632_16_);
                auVar74 = ZEXT1664(stack_node._1616_16_);
                auVar75 = ZEXT1664(stack_node._1600_16_);
                auVar77 = ZEXT1664(stack_node._1584_16_);
                auVar81 = ZEXT1664(CONCAT412(stack_node[0xb5].ptr._4_4_,
                                             CONCAT48((float)stack_node[0xb5].ptr,
                                                      CONCAT44(stack_node[0xb4].ptr._4_4_,
                                                               (float)stack_node[0xb4].ptr))));
                auVar78 = ZEXT1664(CONCAT412(stack_node[0xb3].ptr._4_4_,
                                             CONCAT48((float)stack_node[0xb3].ptr,
                                                      CONCAT44(stack_node[0xb2].ptr._4_4_,
                                                               (float)stack_node[0xb2].ptr))));
                auVar76 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                stack_node[0x99].ptr = 8;
                auVar44 = ZEXT1664(stack_node._1648_16_);
                context = (RayQueryContext *)stack_node[0xad];
                ray = (RayHitK<4> *)stack_node[0xac];
              }
              auVar80 = auVar44._0_16_;
              stack_node[0xaf].ptr = stack_node[0xaf].ptr + 1;
            } while (stack_node[0xae].ptr != stack_node[0xaf].ptr);
          }
          auVar42 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),stack_node._1232_16_,1);
          auVar42 = auVar80 & auVar42;
        } while ((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 -1 < auVar42[0xf]);
        auVar80 = vblendvps_avx(stack_node._1232_16_,*(undefined1 (*) [16])(ray + 0x80),auVar80);
        auVar42 = vshufps_avx(auVar80,auVar80,0xb1);
        stack_node[0x9a].ptr = auVar80._0_8_;
        stack_node[0x9b].ptr = auVar80._8_8_;
        auVar80 = vmaxps_avx(auVar42,auVar80);
        auVar42 = vshufpd_avx(auVar80,auVar80,1);
        auVar55 = vmaxss_avx(auVar42,auVar80);
      } while( true );
    }
    auVar80 = vpcmpeqd_avx(auVar80,auVar80);
    auVar80 = vpcmpeqd_avx(auVar80,(undefined1  [16])valid_i->field_0);
    if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar80[0xf] < '\0')
    {
      auVar66._8_4_ = 0x7fffffff;
      auVar66._0_8_ = 0x7fffffff7fffffff;
      auVar66._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar66);
      auVar72._8_4_ = 0x219392ef;
      auVar72._0_8_ = 0x219392ef219392ef;
      auVar72._12_4_ = 0x219392ef;
      auVar42 = vcmpps_avx(auVar42,auVar72,1);
      auVar42 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar72,auVar42);
      auVar54 = vrcpps_avx(auVar42);
      auVar70._8_4_ = 0x3f800000;
      auVar70._0_8_ = &DAT_3f8000003f800000;
      auVar70._12_4_ = 0x3f800000;
      auVar53 = vfnmadd213ps_fma(auVar42,auVar54,auVar70);
      auVar42 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar66);
      auVar42 = vcmpps_avx(auVar42,auVar72,1);
      auVar40 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar72,auVar42);
      auVar45 = vrcpps_avx(auVar40);
      auVar42 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar66);
      auVar42 = vcmpps_avx(auVar42,auVar72,1);
      auVar42 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar72,auVar42);
      auVar55 = vfnmadd213ps_fma(auVar40,auVar45,auVar70);
      auVar40 = vrcpps_avx(auVar42);
      auVar42 = vfnmadd213ps_fma(auVar42,auVar40,auVar70);
      auVar56 = vfmadd132ps_fma(auVar42,auVar40,auVar40);
      auVar75 = ZEXT1664(auVar56);
      auVar45 = vfmadd132ps_fma(auVar55,auVar45,auVar45);
      auVar73 = ZEXT1664(auVar45);
      auVar54 = vfmadd132ps_fma(auVar53,auVar54,auVar54);
      auVar74 = ZEXT1664(auVar54);
      auVar42 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar40 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar76 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_near[1].field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar42,auVar80);
      auVar77 = ZEXT1664((undefined1  [16])stack_near[1].field_0);
      auVar48._8_4_ = 0xff800000;
      auVar48._0_8_ = 0xff800000ff800000;
      auVar48._12_4_ = 0xff800000;
      auVar80 = vblendvps_avx(auVar48,auVar40,auVar80);
      auVar78 = ZEXT1664(auVar80);
      pNVar35 = stack_node + 2;
      paVar36 = &stack_near[2].field_0;
      auVar81 = ZEXT1664(CONCAT412(auVar56._12_4_ * -*(float *)(ray + 0xc),
                                   CONCAT48(auVar56._8_4_ * -*(float *)(ray + 8),
                                            CONCAT44(auVar56._4_4_ * -*(float *)(ray + 4),
                                                     auVar56._0_4_ * -*(float *)ray))));
      local_16f8 = auVar45._0_4_ * -*(float *)(ray + 0x10);
      fStack_16f4 = auVar45._4_4_ * -*(float *)(ray + 0x14);
      fStack_16f0 = auVar45._8_4_ * -*(float *)(ray + 0x18);
      fStack_16ec = auVar45._12_4_ * -*(float *)(ray + 0x1c);
      local_1708._0_4_ = auVar54._0_4_ * -*(float *)(ray + 0x20);
      local_1708._4_4_ = auVar54._4_4_ * -*(float *)(ray + 0x24);
      local_1708._8_4_ = auVar54._8_4_ * -*(float *)(ray + 0x28);
      local_1708._12_4_ = auVar54._12_4_ * -*(float *)(ray + 0x2c);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      do {
        auVar80 = auVar78._0_16_;
        paVar36 = paVar36 + -1;
        pNVar3 = pNVar35 + -1;
        pNVar35 = pNVar35 + -1;
        bVar21 = true;
        if (pNVar3->ptr != 0xfffffffffffffff8) {
          auVar44 = ZEXT1664((undefined1  [16])*paVar36);
          auVar42 = vcmpps_avx((undefined1  [16])*paVar36,auVar80,1);
          sVar29 = pNVar3->ptr;
          if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar42[0xf] < '\0') {
            do {
              local_1738 = auVar75._0_16_;
              local_1768 = auVar81._0_16_;
              local_1728 = auVar73._0_16_;
              local_1718 = auVar74._0_16_;
              local_1748 = auVar77._0_16_;
              if ((sVar29 & 8) != 0) {
                if (sVar29 == 0xfffffffffffffff8) goto LAB_005510df;
                auVar42 = vcmpps_avx(auVar80,auVar44._0_16_,6);
                auVar44 = ZEXT1664(auVar42);
                if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar42[0xf] < '\0') {
                  uVar24 = (ulong)((uint)sVar29 & 0xf);
                  if (uVar24 != 8) {
                    lVar28 = 0;
                    local_1778 = auVar42;
                    local_1758 = auVar80;
                    do {
                      local_17c0.geomID = *(uint *)((sVar29 & 0xfffffffffffffff0) + lVar28 * 8);
                      local_1790 = (context->scene->geometries).items[local_17c0.geomID].ptr;
                      uVar22 = local_1790->mask;
                      auVar39._4_4_ = uVar22;
                      auVar39._0_4_ = uVar22;
                      auVar39._8_4_ = uVar22;
                      auVar39._12_4_ = uVar22;
                      auVar80 = vpand_avx(auVar39,*(undefined1 (*) [16])(ray + 0x90));
                      auVar80 = vpcmpeqd_avx(auVar80,_DAT_01feba10);
                      auVar42 = auVar44._0_16_ & ~auVar80;
                      if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar42[0xf] < '\0') {
                        mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vandnps_avx(auVar80,auVar44._0_16_);
                        local_17c0.primID =
                             *(uint *)((sVar29 & 0xfffffffffffffff0) + 4 + lVar28 * 8);
                        local_17c0.valid = (int *)&mask;
                        local_17c0.geometryUserPtr = local_1790->userPtr;
                        local_17c0.context = context->user;
                        local_17c0.N = 4;
                        local_1788 = 0;
                        local_1780 = context->args;
                        pp_Var27 = (_func_int **)local_1780->intersect;
                        if (pp_Var27 == (_func_int **)0x0) {
                          pp_Var27 = local_1790[1].super_RefCount._vptr_RefCount;
                        }
                        local_17c0.rayhit = (RTCRayHitN *)ray;
                        (*(code *)pp_Var27)(&local_17c0);
                        auVar74 = ZEXT1664(local_1718);
                        auVar73 = ZEXT1664(local_1728);
                        auVar75 = ZEXT1664(local_1738);
                        auVar76 = ZEXT1664(CONCAT412(0x7f800000,
                                                     CONCAT48(0x7f800000,0x7f8000007f800000)));
                        auVar77 = ZEXT1664(local_1748);
                        auVar78 = ZEXT1664(local_1758);
                        auVar81 = ZEXT1664(local_1768);
                        auVar44 = ZEXT1664(local_1778);
                      }
                      auVar80 = auVar78._0_16_;
                      auVar42 = auVar44._0_16_;
                      lVar28 = lVar28 + 1;
                    } while (uVar24 - 8 != lVar28);
                  }
                  auVar80 = vblendvps_avx(auVar80,*(undefined1 (*) [16])(ray + 0x80),auVar42);
                  auVar78 = ZEXT1664(auVar80);
                }
                break;
              }
              uVar34 = 0;
              auVar44 = ZEXT1664(auVar76._0_16_);
              sVar26 = 8;
              uVar24 = 0;
              do {
                sVar25 = *(size_t *)((sVar29 & 0xfffffffffffffff0) + uVar24 * 8);
                sVar30 = sVar26;
                if (sVar25 != 8) {
                  uVar23 = *(undefined4 *)(sVar29 + 0x20 + uVar24 * 4);
                  auVar49._4_4_ = uVar23;
                  auVar49._0_4_ = uVar23;
                  auVar49._8_4_ = uVar23;
                  auVar49._12_4_ = uVar23;
                  auVar54 = vfmadd213ps_fma(auVar49,local_1738,local_1768);
                  uVar23 = *(undefined4 *)(sVar29 + 0x40 + uVar24 * 4);
                  auVar52._4_4_ = uVar23;
                  auVar52._0_4_ = uVar23;
                  auVar52._8_4_ = uVar23;
                  auVar52._12_4_ = uVar23;
                  auVar6._4_4_ = fStack_16f4;
                  auVar6._0_4_ = local_16f8;
                  auVar6._8_4_ = fStack_16f0;
                  auVar6._12_4_ = fStack_16ec;
                  auVar45 = vfmadd213ps_fma(auVar52,local_1728,auVar6);
                  uVar23 = *(undefined4 *)(sVar29 + 0x60 + uVar24 * 4);
                  auVar58._4_4_ = uVar23;
                  auVar58._0_4_ = uVar23;
                  auVar58._8_4_ = uVar23;
                  auVar58._12_4_ = uVar23;
                  auVar56 = vfmadd213ps_fma(auVar58,local_1718,local_1708);
                  uVar23 = *(undefined4 *)(sVar29 + 0x30 + uVar24 * 4);
                  auVar61._4_4_ = uVar23;
                  auVar61._0_4_ = uVar23;
                  auVar61._8_4_ = uVar23;
                  auVar61._12_4_ = uVar23;
                  auVar53 = vfmadd213ps_fma(auVar61,local_1738,local_1768);
                  uVar23 = *(undefined4 *)(sVar29 + 0x50 + uVar24 * 4);
                  auVar67._4_4_ = uVar23;
                  auVar67._0_4_ = uVar23;
                  auVar67._8_4_ = uVar23;
                  auVar67._12_4_ = uVar23;
                  auVar55 = vfmadd213ps_fma(auVar67,local_1728,auVar6);
                  uVar23 = *(undefined4 *)(sVar29 + 0x70 + uVar24 * 4);
                  auVar71._4_4_ = uVar23;
                  auVar71._0_4_ = uVar23;
                  auVar71._8_4_ = uVar23;
                  auVar71._12_4_ = uVar23;
                  auVar62 = vfmadd213ps_fma(auVar71,local_1718,local_1708);
                  auVar42 = vpminsd_avx(auVar54,auVar53);
                  auVar40 = vpminsd_avx(auVar45,auVar55);
                  auVar42 = vpmaxsd_avx(auVar42,auVar40);
                  auVar40 = vpminsd_avx(auVar56,auVar62);
                  auVar40 = vpmaxsd_avx(auVar42,auVar40);
                  auVar42 = vpmaxsd_avx(auVar54,auVar53);
                  auVar54 = vpmaxsd_avx(auVar45,auVar55);
                  auVar45 = vpminsd_avx(auVar42,auVar54);
                  auVar42 = vpmaxsd_avx(auVar56,auVar62);
                  auVar54 = vpmaxsd_avx(auVar40,local_1748);
                  auVar42 = vpminsd_avx(auVar42,auVar80);
                  auVar42 = vpminsd_avx(auVar45,auVar42);
                  auVar42 = vcmpps_avx(auVar54,auVar42,2);
                  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar42[0xf] < '\0') {
                    aVar4 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar76._0_16_,auVar40,auVar42);
                    aVar38 = auVar44._0_16_;
                    auVar42 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar38,1);
                    sVar32 = sVar25;
                    aVar19 = aVar38;
                    aVar20 = aVar4;
                    if (((((auVar42 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar42 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar42 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar42[0xf]) ||
                       (sVar30 = sVar25, sVar32 = sVar26, aVar19 = aVar4, aVar20 = aVar38,
                       sVar26 != 8)) {
                      uVar34 = uVar34 + 1;
                      pNVar35->ptr = sVar32;
                      pNVar35 = pNVar35 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar36->v = aVar20;
                      paVar36 = paVar36 + 1;
                      auVar44 = ZEXT1664((undefined1  [16])aVar19);
                    }
                    else {
                      auVar44 = ZEXT1664((undefined1  [16])aVar4);
                    }
                  }
                }
              } while ((sVar25 != 8) &&
                      (bVar37 = uVar24 < 3, sVar26 = sVar30, uVar24 = uVar24 + 1, bVar37));
              if (1 < uVar34 && sVar30 != 8) {
                aVar4 = paVar36[-2];
                auVar42 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar36[-1],1);
                if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar42[0xf] < '\0') {
                  paVar36[-2] = paVar36[-1];
                  paVar36[-1] = aVar4;
                  auVar42 = vpermilps_avx(*(undefined1 (*) [16])(pNVar35 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar35 + -2) = auVar42;
                }
                if (uVar34 != 2) {
                  aVar4 = paVar36[-3];
                  auVar42 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar36[-1],1);
                  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar42[0xf] < '\0') {
                    paVar36[-3] = paVar36[-1];
                    paVar36[-1] = aVar4;
                    sVar29 = pNVar35[-3].ptr;
                    pNVar35[-3].ptr = pNVar35[-1].ptr;
                    pNVar35[-1].ptr = sVar29;
                  }
                  aVar4 = paVar36[-3];
                  auVar42 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar36[-2],1);
                  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar42[0xf] < '\0') {
                    paVar36[-3] = paVar36[-2];
                    paVar36[-2] = aVar4;
                    auVar42 = vpermilps_avx(*(undefined1 (*) [16])(pNVar35 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar35 + -3) = auVar42;
                  }
                }
              }
              sVar29 = sVar30;
            } while (sVar30 != 8);
          }
          bVar21 = false;
        }
LAB_005510df:
      } while (!bVar21);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }